

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void gl4cts::EnhancedLayouts::debug_proc
               (GLenum source,GLenum type,GLuint id,GLenum severity,GLsizei param_5,GLchar *message,
               void *info)

{
  TestContext *this;
  TestLog *this_00;
  MessageBuilder *pMVar1;
  _Setw local_1e0;
  _Setw local_1dc;
  _Setw local_1d8 [4];
  MessageBuilder local_1c8;
  char *local_48;
  GLchar *severity_str;
  GLchar *type_str;
  GLchar *source_str;
  Context *ctx;
  GLchar *message_local;
  GLenum local_18;
  GLsizei param_4_local;
  GLenum severity_local;
  GLuint id_local;
  GLenum type_local;
  GLenum source_local;
  
  source_str = (GLchar *)info;
  type_str = "Unknown";
  severity_str = "Unknown";
  local_48 = "Unknown";
  switch(source) {
  case 0x8246:
    type_str = "API";
    break;
  case 0x8247:
    type_str = "WS";
    break;
  case 0x8248:
    type_str = "COM";
    break;
  case 0x8249:
    type_str = "3RD";
    break;
  case 0x824a:
    type_str = "APP";
    break;
  case 0x824b:
    type_str = "OTR";
  }
  switch(type) {
  case 0x824c:
    severity_str = "ERROR";
    break;
  case 0x824d:
    severity_str = "DEPRECATED_BEHAVIOR";
    break;
  case 0x824e:
    severity_str = "UNDEFINED_BEHAVIOR";
    break;
  case 0x824f:
    severity_str = "PORTABILITY";
    break;
  case 0x8250:
    severity_str = "PERFORMANCE";
    break;
  case 0x8251:
    severity_str = "OTHER";
    break;
  default:
    break;
  case 0x8268:
    severity_str = "MARKER";
    break;
  case 0x8269:
    severity_str = "PUSH_GROUP";
    break;
  case 0x826a:
    severity_str = "POP_GROUP";
  }
  if (severity == 0x826b) {
    local_48 = "N";
  }
  else if (severity == 0x9146) {
    local_48 = "H";
  }
  else if (severity == 0x9147) {
    local_48 = "M";
  }
  else if (severity == 0x9148) {
    local_48 = "L";
  }
  ctx = (Context *)message;
  message_local._4_4_ = param_5;
  local_18 = severity;
  param_4_local = id;
  severity_local = type;
  id_local = source;
  this = deqp::Context::getTestContext((Context *)info);
  this_00 = tcu::TestContext::getLog(this);
  tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [13])"DEBUG_INFO: ");
  local_1d8[0] = std::setw(3);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1d8);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&type_str);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a430a7);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_48);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a430a7);
  local_1dc = std::setw(0x12);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1dc);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&severity_str);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a430a7);
  local_1e0 = std::setw(0xc);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1e0);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)&param_4_local);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a0a8b4);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char **)&ctx);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  return;
}

Assistant:

void GLW_APIENTRY debug_proc(GLenum source, GLenum type, GLuint id, GLenum severity, GLsizei /* length */,
							 const GLchar* message, void* info)
{
	deqp::Context* ctx = (deqp::Context*)info;

	const GLchar* source_str   = "Unknown";
	const GLchar* type_str	 = "Unknown";
	const GLchar* severity_str = "Unknown";

	switch (source)
	{
	case GL_DEBUG_SOURCE_API:
		source_str = "API";
		break;
	case GL_DEBUG_SOURCE_APPLICATION:
		source_str = "APP";
		break;
	case GL_DEBUG_SOURCE_OTHER:
		source_str = "OTR";
		break;
	case GL_DEBUG_SOURCE_SHADER_COMPILER:
		source_str = "COM";
		break;
	case GL_DEBUG_SOURCE_THIRD_PARTY:
		source_str = "3RD";
		break;
	case GL_DEBUG_SOURCE_WINDOW_SYSTEM:
		source_str = "WS";
		break;
	default:
		break;
	}

	switch (type)
	{
	case GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR:
		type_str = "DEPRECATED_BEHAVIOR";
		break;
	case GL_DEBUG_TYPE_ERROR:
		type_str = "ERROR";
		break;
	case GL_DEBUG_TYPE_MARKER:
		type_str = "MARKER";
		break;
	case GL_DEBUG_TYPE_OTHER:
		type_str = "OTHER";
		break;
	case GL_DEBUG_TYPE_PERFORMANCE:
		type_str = "PERFORMANCE";
		break;
	case GL_DEBUG_TYPE_POP_GROUP:
		type_str = "POP_GROUP";
		break;
	case GL_DEBUG_TYPE_PORTABILITY:
		type_str = "PORTABILITY";
		break;
	case GL_DEBUG_TYPE_PUSH_GROUP:
		type_str = "PUSH_GROUP";
		break;
	case GL_DEBUG_TYPE_UNDEFINED_BEHAVIOR:
		type_str = "UNDEFINED_BEHAVIOR";
		break;
	default:
		break;
	}

	switch (severity)
	{
	case GL_DEBUG_SEVERITY_HIGH:
		severity_str = "H";
		break;
	case GL_DEBUG_SEVERITY_LOW:
		severity_str = "L";
		break;
	case GL_DEBUG_SEVERITY_MEDIUM:
		severity_str = "M";
		break;
	case GL_DEBUG_SEVERITY_NOTIFICATION:
		severity_str = "N";
		break;
	default:
		break;
	}

	ctx->getTestContext().getLog() << tcu::TestLog::Message << "DEBUG_INFO: " << std::setw(3) << source_str << "|"
								   << severity_str << "|" << std::setw(18) << type_str << "|" << std::setw(12) << id
								   << ": " << message << tcu::TestLog::EndMessage;
}